

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parameters.pb.cc
# Opt level: O1

bool __thiscall
CoreML::Specification::BoolParameter::MergePartialFromCodedStream
          (BoolParameter *this,CodedInputStream *input)

{
  byte bVar1;
  uint8 uVar2;
  byte *pbVar3;
  uint8 *puVar4;
  bool bVar5;
  uint32 uVar6;
  int iVar7;
  uint tag;
  ulong uVar8;
  pair<unsigned_long,_bool> pVar9;
  
  do {
    pbVar3 = input->buffer_;
    uVar6 = 0;
    if (pbVar3 < input->buffer_end_) {
      bVar1 = *pbVar3;
      uVar6 = (uint32)bVar1;
      if ((char)bVar1 < '\x01') goto LAB_003ca764;
      input->buffer_ = pbVar3 + 1;
      uVar8 = (ulong)bVar1 | 0x100000000;
    }
    else {
LAB_003ca764:
      uVar6 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar6);
      uVar8 = 0;
      if (uVar6 - 1 < 0x7f) {
        uVar8 = 0x100000000;
      }
      uVar8 = uVar6 | uVar8;
    }
    tag = (uint)uVar8;
    if (((uVar8 & 0x100000000) == 0) || ((char)uVar8 != '\b' || (tag & 0xfffffff8) != 8)) {
      iVar7 = 7;
      if (((tag & 7) != 4 && tag != 0) &&
         (bVar5 = google::protobuf::internal::WireFormatLite::SkipField(input,tag), iVar7 = 6, bVar5
         )) goto LAB_003ca7f6;
    }
    else {
      puVar4 = input->buffer_;
      if ((puVar4 < input->buffer_end_) && (uVar2 = *puVar4, -1 < (long)(char)uVar2)) {
        input->buffer_ = puVar4 + 1;
        pVar9._8_8_ = 1;
        pVar9.first = (long)(char)uVar2;
      }
      else {
        pVar9 = google::protobuf::io::CodedInputStream::ReadVarint64Fallback(input);
      }
      iVar7 = 6;
      if (((undefined1  [16])pVar9 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        this->defaultvalue_ = pVar9.first != 0;
LAB_003ca7f6:
        iVar7 = 0;
      }
    }
    if (iVar7 != 0) {
      return iVar7 != 6;
    }
  } while( true );
}

Assistant:

bool BoolParameter::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:CoreML.Specification.BoolParameter)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(127u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // bool defaultValue = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(8u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &defaultvalue_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:CoreML.Specification.BoolParameter)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:CoreML.Specification.BoolParameter)
  return false;
#undef DO_
}